

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O0

bool __thiscall
bssl::SSLTranscript::CopyToHashContext(SSLTranscript *this,EVP_MD_CTX *ctx,EVP_MD *digest)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  EVP_MD *md;
  EVP_MD_CTX *in;
  EVP_MD *transcript_digest;
  EVP_MD *digest_local;
  EVP_MD_CTX *ctx_local;
  SSLTranscript *this_local;
  
  md = (EVP_MD *)Digest(this);
  if (md != (EVP_MD *)0x0) {
    iVar2 = EVP_MD_type(md);
    iVar3 = EVP_MD_type((EVP_MD *)digest);
    if (iVar2 == iVar3) {
      in = (EVP_MD_CTX *)
           internal::
           StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
           ::get(&this->hash_);
      iVar2 = EVP_MD_CTX_copy_ex((EVP_MD_CTX *)ctx,in);
      return iVar2 != 0;
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    this_local._7_1_ = HashBuffer(this,ctx,digest);
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_transcript.cc"
                  ,0x99);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SSLTranscript::CopyToHashContext(EVP_MD_CTX *ctx,
                                      const EVP_MD *digest) const {
  const EVP_MD *transcript_digest = Digest();
  if (transcript_digest != nullptr &&
      EVP_MD_type(transcript_digest) == EVP_MD_type(digest)) {
    return EVP_MD_CTX_copy_ex(ctx, hash_.get());
  }

  if (buffer_) {
    return HashBuffer(ctx, digest);
  }

  OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
  return false;
}